

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
HelpGameCommand::trigger
          (HelpGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  int iVar1;
  GameCommand *pGVar2;
  PlayerInfo *pPVar3;
  bool bVar4;
  int iVar5;
  basic_string_view<char,_std::char_traits<char>_> *in_whitespace;
  undefined1 auVar6 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  size_t local_160;
  char *local_158;
  size_t local_150;
  char *local_148;
  size_t local_110;
  char *local_108;
  string local_f0;
  __sv_type local_d0;
  undefined1 local_c0 [8];
  string msg;
  undefined1 local_98 [4];
  int i;
  basic_string_view<char,_std::char_traits<char>_> *local_88;
  char *local_80;
  undefined1 local_78 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  split_parameters;
  anon_class_24_3_c4a9eb0b getAccessCommands;
  Server *pSStack_38;
  uint cmdCount;
  GameCommand *cmd;
  PlayerInfo *player_local;
  Server *source_local;
  HelpGameCommand *this_local;
  string_view parameters_local;
  
  local_80 = parameters._M_str;
  in_whitespace = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_len;
  getAccessCommands.cmdCount._4_4_ = 0;
  split_parameters.second._M_str = (char *)&player_local;
  getAccessCommands.source = &stack0xffffffffffffffc8;
  getAccessCommands.cmd = (GameCommand **)((long)&getAccessCommands.cmdCount + 4);
  local_88 = in_whitespace;
  cmd = (GameCommand *)player;
  player_local = (PlayerInfo *)source;
  source_local = (Server *)this;
  this_local = (HelpGameCommand *)in_whitespace;
  parameters_local._M_len = (size_t)local_80;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_98," \t");
  jessilib::
  word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)local_78,(jessilib *)&local_88,
             (basic_string_view<char,_std::char_traits<char>_> *)local_98,in_whitespace);
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_78);
  if (bVar4) {
    for (msg.field_2._12_4_ = 0; pPVar3 = player_local, pGVar2 = cmd,
        (int)msg.field_2._12_4_ <= *(int *)(cmd + 0x1b0);
        msg.field_2._12_4_ = msg.field_2._12_4_ + 1) {
      trigger(RenX::Server*,RenX::PlayerInfo*,std::basic_string_view<char,std::char_traits<char>>)::
      $_0::operator()[abi_cxx11_
                ((string *)local_c0,&split_parameters.second._M_str,msg.field_2._12_4_);
      bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c0);
      pPVar3 = player_local;
      pGVar2 = cmd;
      if (!bVar4) {
        trigger(RenX::Server*,RenX::PlayerInfo*,std::basic_string_view<char,std::char_traits<char>>)
        ::$_0::operator()[abi_cxx11_(&local_f0,&split_parameters.second._M_str,msg.field_2._12_4_);
        local_d0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_f0);
        RenX::Server::sendMessage(pPVar3,pGVar2,local_d0._M_len,local_d0._M_str);
        std::__cxx11::string::~string((string *)&local_f0);
      }
      std::__cxx11::string::~string((string *)local_c0);
    }
    if (getAccessCommands.cmdCount._4_4_ == 0) {
      bVar7 = sv("No listed commands available.",0x1d);
      local_110 = bVar7._M_len;
      local_108 = bVar7._M_str;
      RenX::Server::sendMessage(pPVar3,pGVar2,local_110,local_108);
    }
  }
  else {
    pSStack_38 = (Server *)
                 RenX::Server::getCommand(player_local,local_78,split_parameters.first._M_len);
    pPVar3 = player_local;
    pGVar2 = cmd;
    if (pSStack_38 == (Server *)0x0) {
      bVar7 = sv("Error: Command not found.",0x19);
      local_160 = bVar7._M_len;
      local_158 = bVar7._M_str;
      RenX::Server::sendMessage(pPVar3,pGVar2,local_160,local_158);
    }
    else {
      iVar1 = *(int *)(cmd + 0x1b0);
      iVar5 = RenX::GameCommand::getAccessLevel();
      pPVar3 = player_local;
      pGVar2 = cmd;
      if (iVar1 < iVar5) {
        bVar7 = sv("Access Denied.",0xe);
        local_150 = bVar7._M_len;
        local_148 = bVar7._M_str;
        RenX::Server::sendMessage(pPVar3,pGVar2,local_150,local_148);
      }
      else {
        auVar6 = (*(code *)**(undefined8 **)pSStack_38)
                           (pSStack_38,split_parameters.first._M_str,split_parameters.second._M_len)
        ;
        RenX::Server::sendMessage(pPVar3,pGVar2,auVar6._0_8_,auVar6._8_8_);
      }
    }
  }
  return;
}

Assistant:

void HelpGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	RenX::GameCommand *cmd;
	unsigned int cmdCount = 0;
	auto getAccessCommands = [&](int accessLevel) {
		std::string list;
		unsigned int i = 0;
		while (i != source->getCommandCount()) {
			cmd = source->getCommand(i++);
			if (cmd->getAccessLevel() == accessLevel) {
				cmdCount++;
				list = "Access level "s + std::to_string(accessLevel) + " commands: "s;
				list += cmd->getTrigger();
				break;
			}
		}
		while (i != source->getCommandCount()) {
			cmd = source->getCommand(i++);
			if (cmd->getAccessLevel() == accessLevel) {
				cmdCount++;
				list += ", ";
				list += cmd->getTrigger();
			}
		}
		return list;
	};

	auto split_parameters = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (split_parameters.first.empty()) {
		for (int i = 0; i <= player->access; i++) {
			auto msg = getAccessCommands(i);
			if (!msg.empty()) {
				source->sendMessage(*player, getAccessCommands(i));
			}
		}
		if (cmdCount == 0) {
			source->sendMessage(*player, "No listed commands available."sv);
		}
	}
	else {
		cmd = source->getCommand(split_parameters.first);
		if (cmd != nullptr) {
			if (player->access >= cmd->getAccessLevel()) {
				source->sendMessage(*player, cmd->getHelp(split_parameters.second));
			}
			else {
				source->sendMessage(*player, "Access Denied."sv);
			}
		}
		else {
			source->sendMessage(*player, "Error: Command not found."sv);
		}
	}
}